

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

int __thiscall RenX::Server::OnRehash(Server *this)

{
  string *__str;
  string *__str_00;
  string *__str_01;
  unsigned_short uVar1;
  bool bVar2;
  undefined8 uVar3;
  EVP_PKEY_CTX *ctx;
  string oldPass;
  string oldClientHostname;
  string oldHostname;
  
  __str = &this->m_hostname;
  std::__cxx11::string::string((string *)&oldHostname,__str);
  __str_00 = &this->m_clientHostname;
  std::__cxx11::string::string((string *)&oldClientHostname,__str_00);
  __str_01 = &this->m_pass;
  std::__cxx11::string::string((string *)&oldPass,__str_01);
  uVar1 = this->m_port;
  std::
  vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
  ::clear(&this->m_commands);
  getCore();
  uVar3 = Jupiter::Plugin::getConfig();
  ctx = (EVP_PKEY_CTX *)
        Jupiter::Config::getSection
                  (uVar3,(this->m_configSection)._M_string_length,
                   (this->m_configSection)._M_dataplus._M_p);
  init(this,ctx);
  if ((this->m_port == 0) || ((this->m_hostname)._M_string_length != 0)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (__str,&oldHostname);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (__str_00,&oldClientHostname);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (__str_01,&oldPass);
    this->m_port = uVar1;
  }
  else {
    bVar2 = jessilib::equalsi<char,char>(&oldHostname,__str);
    if (bVar2 && uVar1 == this->m_port) {
      bVar2 = jessilib::equalsi<char,char>(&oldClientHostname,__str_00);
      if (bVar2) {
        bVar2 = jessilib::equalsi<char,char>(&oldPass,__str_01);
        if (bVar2) goto LAB_0013af7a;
      }
    }
    reconnect(this,Rehash);
  }
LAB_0013af7a:
  std::__cxx11::string::~string((string *)&oldPass);
  std::__cxx11::string::~string((string *)&oldClientHostname);
  std::__cxx11::string::~string((string *)&oldHostname);
  return 0;
}

Assistant:

int RenX::Server::OnRehash() {
	std::string oldHostname = m_hostname;
	std::string oldClientHostname = m_clientHostname;
	std::string oldPass = m_pass;
	unsigned short oldPort = m_port;
	int oldSteamFormat = m_steamFormat;
	m_commands.clear();
	init(*RenX::getCore()->getConfig().getSection(m_configSection));
	if (m_port == 0 || !m_hostname.empty()) {
		m_hostname = oldHostname;
		m_clientHostname = oldClientHostname;
		m_pass = oldPass;
		m_port = oldPort;
	}
	else if (!jessilib::equalsi(oldHostname, m_hostname)
		|| oldPort != m_port
		|| !jessilib::equalsi(oldClientHostname, m_clientHostname)
		|| !jessilib::equalsi(oldPass, m_pass)) {
		reconnect(RenX::DisconnectReason::Rehash);
	}

	return 0;
}